

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  secp256k1_fe *psVar11;
  ulong uVar12;
  int extraout_EDX;
  uint uVar13;
  uint extraout_EDX_00;
  secp256k1_ge *a;
  secp256k1_ge *a_00;
  ulong uVar14;
  secp256k1_gej *psVar15;
  ulong uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *r_00;
  ulong uVar18;
  secp256k1_gej *r_01;
  ulong uVar19;
  secp256k1_gej *a_01;
  secp256k1_ge *a_02;
  secp256k1_gej *a_03;
  ulong uVar20;
  secp256k1_gej *r_02;
  secp256k1_gej *a_04;
  ulong uVar21;
  secp256k1_fe sStack_378;
  secp256k1_fe sStack_348;
  ulong uStack_318;
  secp256k1_gej *psStack_310;
  ulong uStack_308;
  ulong uStack_300;
  secp256k1_gej *psStack_2f8;
  secp256k1_gej *psStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  code *pcStack_2d0;
  int iStack_2c4;
  secp256k1_gej *psStack_2c0;
  code *pcStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  ulong uStack_288;
  secp256k1_gej *psStack_280;
  ulong uStack_278;
  secp256k1_fe *psStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  int iStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  int iStack_1a8;
  int iStack_1a4;
  undefined1 auStack_1a0 [56];
  ulong uStack_168;
  ulong uStack_160;
  secp256k1_gej *psStack_158;
  ulong uStack_150;
  ulong uStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  uint64_t uStack_60;
  int iStack_58;
  int iStack_54;
  
  psVar11 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_001478c4:
    secp256k1_ecmult_table_get_ge_storage_cold_1();
  }
  else {
    if (n < -0x3fff) goto LAB_001478c4;
    if (n < 0x4000) {
      if (0 < n) {
        secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
        return;
      }
      secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
      psVar11 = &r->y;
      secp256k1_fe_verify(psVar11);
      secp256k1_fe_verify_magnitude(psVar11,1);
      uVar4 = (r->y).n[1];
      uVar5 = (r->y).n[2];
      uVar6 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar4;
      (r->y).n[2] = 0x3ffffffffffffc - uVar5;
      (r->y).n[3] = 0x3ffffffffffffc - uVar6;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar11);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  pcStack_2b8 = (code *)0x1478f3;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  pcStack_2b8 = (code *)0x1478fb;
  secp256k1_ge_verify(a);
  pcStack_2b8 = (code *)0x147903;
  secp256k1_fe_verify(psVar11);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a->infinity;
    pcStack_2b8 = (code *)0x14792f;
    secp256k1_fe_sqr(&sStack_140,psVar11);
    pcStack_2b8 = (code *)0x147945;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,psVar11);
    pcStack_2b8 = (code *)0x147953;
    secp256k1_fe_mul(&r->x,&a->x,&sStack_140);
    pcStack_2b8 = (code *)0x147966;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a->y,&sStack_b0);
    r_02 = (secp256k1_gej *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_00147991:
    pcStack_2b8 = (code *)0x147996;
    secp256k1_fe_verify(&r_02->x);
    pcStack_2b8 = (code *)0x14799e;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_270 = &((secp256k1_gej *)pre)->z;
  pcStack_2b8 = (code *)0x1479f5;
  secp256k1_fe_mul(&sStack_140,psStack_270,psVar11);
  pcStack_2b8 = (code *)0x147a08;
  secp256k1_fe_sqr(&sStack_b0,&sStack_140);
  sStack_110.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_110.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_110.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_110.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_110.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_110.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_110.normalized = (((secp256k1_gej *)pre)->x).normalized;
  pcStack_2b8 = (code *)0x147a3d;
  secp256k1_fe_mul((secp256k1_fe *)auStack_200,&a->x,&sStack_b0);
  auStack_260._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_260._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_260._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_260._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_260._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_260._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_260._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  pcStack_2b8 = (code *)0x147a7e;
  psStack_2a0 = (secp256k1_gej *)pre;
  secp256k1_fe_mul(&sStack_e0,&a->y,&sStack_b0);
  pcStack_2b8 = (code *)0x147a91;
  secp256k1_fe_mul(&sStack_e0,&sStack_e0,&sStack_140);
  pcStack_2b8 = (code *)0x147a99;
  secp256k1_fe_verify(&sStack_110);
  psVar15 = (secp256k1_gej *)0x4;
  pcStack_2b8 = (code *)0x147aa6;
  secp256k1_fe_verify_magnitude(&sStack_110,4);
  r_02 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_110.n[0]);
  uVar20 = 0x9ffffffffffff6 - sStack_110.n[1];
  uVar14 = 0x9ffffffffffff6 - sStack_110.n[2];
  a_03 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_110.n[3]);
  uStack_2a8 = 0x9fffffffffff6 - sStack_110.n[4];
  uStack_148 = 5;
  pcStack_2b8 = (code *)0x147b14;
  auStack_1a0._48_8_ = r_02;
  uStack_168 = uVar20;
  uStack_160 = uVar14;
  psStack_158 = a_03;
  uStack_150 = uStack_2a8;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  pcStack_2b8 = (code *)0x147b1c;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  a_04 = (secp256k1_gej *)auStack_200;
  pcStack_2b8 = (code *)0x147b2c;
  r_00 = a_04;
  secp256k1_fe_verify((secp256k1_fe *)a_04);
  if ((int)auStack_200._40_4_ < 0x1c) {
    psStack_268 = (secp256k1_gej *)((long)(r_02->x).n + auStack_200._0_8_);
    uStack_278 = uVar20 + auStack_200._8_8_;
    uStack_288 = uVar14 + auStack_200._16_8_;
    psStack_280 = (secp256k1_gej *)((long)(a_03->x).n + auStack_200._24_8_);
    uStack_2a8 = uStack_2a8 + auStack_200._32_8_;
    uStack_148 = (ulong)(auStack_200._40_4_ + 5);
    pcStack_2b8 = (code *)0x147bac;
    auStack_1a0._48_8_ = psStack_268;
    uStack_168 = uStack_278;
    uStack_160 = uStack_288;
    psStack_158 = psStack_280;
    uStack_150 = uStack_2a8;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    pcStack_2b8 = (code *)0x147bbc;
    secp256k1_fe_verify(&sStack_e0);
    psVar15 = (secp256k1_gej *)0x1;
    pcStack_2b8 = (code *)0x147bc9;
    secp256k1_fe_verify_magnitude(&sStack_e0,1);
    a_04 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_e0.n[0]);
    r_02 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_e0.n[1]);
    uStack_2b0 = 0x3ffffffffffffc - sStack_e0.n[2];
    uVar14 = 0x3ffffffffffffc - sStack_e0.n[3];
    uVar20 = 0x3fffffffffffc - sStack_e0.n[4];
    auStack_1a0._40_8_ = 2;
    pcStack_2b8 = (code *)0x147c39;
    auStack_1a0._0_8_ = a_04;
    auStack_1a0._8_8_ = r_02;
    auStack_1a0._16_8_ = uStack_2b0;
    auStack_1a0._24_8_ = uVar14;
    auStack_1a0._32_8_ = uVar20;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    pcStack_2b8 = (code *)0x147c41;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    a_03 = (secp256k1_gej *)auStack_260;
    pcStack_2b8 = (code *)0x147c4e;
    r_00 = a_03;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x1e < (int)auStack_260._40_4_) goto LAB_00148175;
    psStack_298 = (secp256k1_gej *)((long)(a_04->x).n + auStack_260._0_8_);
    psStack_290 = (secp256k1_gej *)((long)(r_02->x).n + auStack_260._8_8_);
    uVar21 = uStack_2b0 + auStack_260._16_8_;
    uStack_2b0 = uVar14 + auStack_260._24_8_;
    uVar14 = uVar20 + auStack_260._32_8_;
    uVar20 = 0x1000003d0;
    auStack_1a0._44_4_ = 0;
    auStack_1a0._40_4_ = auStack_260._40_4_ + 2;
    pcStack_2b8 = (code *)0x147cd1;
    auStack_1a0._0_8_ = psStack_298;
    auStack_1a0._8_8_ = psStack_290;
    auStack_1a0._16_8_ = uVar21;
    auStack_1a0._24_8_ = uStack_2b0;
    auStack_1a0._32_8_ = uVar14;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    pcStack_2b8 = (code *)0x147cde;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    uVar8 = (uStack_2a8 >> 0x30) * 0x1000003d1 + (long)psStack_268;
    if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
      uVar18 = uStack_278 + (uVar8 >> 0x34);
      uVar12 = (uVar18 >> 0x34) + uStack_288;
      uVar19 = (long)(psStack_280->x).n + (uVar12 >> 0x34);
      uVar16 = (uVar19 >> 0x34) + (uStack_2a8 & 0xffffffffffff);
      if ((((uVar18 | uVar8 | uVar12 | uVar19) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
         (((uVar8 | 0x1000003d0) & uVar18 & uVar12 & uVar19 & (uVar16 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        pcStack_2b8 = (code *)0x1480a1;
        secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
        uVar20 = (uVar14 >> 0x30) * 0x1000003d1 + (long)psStack_298;
        if (((uVar20 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar20 & 0xfffffffffffff) == 0)) {
          uVar12 = (long)(psStack_290->x).n + (uVar20 >> 0x34);
          uVar21 = (uVar12 >> 0x34) + uVar21;
          uVar8 = (uVar21 >> 0x34) + uStack_2b0;
          uVar14 = (uVar8 >> 0x34) + (uVar14 & 0xffffffffffff);
          if ((((uVar12 | uVar20 | uVar21 | uVar8) & 0xfffffffffffff) == 0 && uVar14 == 0) ||
             (((uVar20 | 0x1000003d0) & uVar12 & uVar21 & uVar8 & (uVar14 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            pcStack_2b8 = (code *)0x14816b;
            secp256k1_gej_double_var((secp256k1_gej *)r,psStack_2a0,(secp256k1_fe *)0x0);
            return;
          }
        }
        pcStack_2b8 = (code *)0x148157;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_04 = (secp256k1_gej *)(auStack_1a0 + 0x30);
    pcStack_2b8 = (code *)0x147dc7;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_270,(secp256k1_fe *)a_04);
    r_02 = (secp256k1_gej *)&stack0xffffffffffffff80;
    pcStack_2b8 = (code *)0x147dda;
    secp256k1_fe_sqr((secp256k1_fe *)r_02,(secp256k1_fe *)a_04);
    pcStack_2b8 = (code *)0x147de2;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2b8 = (code *)0x147def;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)r_02,1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3fffffffffffc - uStack_60;
    iStack_58 = 2;
    iStack_54 = 0;
    pcStack_2b8 = (code *)0x147e37;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    a_03 = (secp256k1_gej *)(auStack_260 + 0x30);
    pcStack_2b8 = (code *)0x147e4d;
    secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)r_02,(secp256k1_fe *)a_04);
    pcStack_2b8 = (code *)0x147e65;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_200 + 0x30),&sStack_110,(secp256k1_fe *)r_02);
    psVar15 = (secp256k1_gej *)auStack_1a0;
    pcStack_2b8 = (code *)0x147e75;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar15);
    pcStack_2b8 = (code *)0x147e7d;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x147e85;
    r_00 = a_03;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar7 = iStack_208 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014817a;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + uStack_228;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + uStack_220;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + uStack_218;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_210;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x147ed8;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x147ee0;
    secp256k1_fe_verify(&r->x);
    r_02 = (secp256k1_gej *)(auStack_200 + 0x30);
    pcStack_2b8 = (code *)0x147ef0;
    r_00 = r_02;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    iVar7 = iStack_1a8 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014817f;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    r_02 = (secp256k1_gej *)(auStack_200 + 0x30);
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + uStack_1c8;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + uStack_1c0;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + uStack_1b8;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_1b0;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x147f3f;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x147f47;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x147f4f;
    r_00 = r_02;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    iVar7 = iStack_1a8 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_00148184;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    r_02 = (secp256k1_gej *)(auStack_200 + 0x30);
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + uStack_1c8;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + uStack_1c0;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + uStack_1b8;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_1b0;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x147f9e;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x147fa6;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2b8 = (code *)0x147fae;
    r_00 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar7 = (((secp256k1_gej *)r)->x).magnitude + iStack_1a8;
    if (0x20 < iVar7) goto LAB_00148189;
    auStack_200._48_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
    uStack_1c8 = (((secp256k1_gej *)r)->x).n[1] + uStack_1c8;
    uStack_1c0 = (((secp256k1_gej *)r)->x).n[2] + uStack_1c0;
    uStack_1b8 = (((secp256k1_gej *)r)->x).n[3] + uStack_1b8;
    uStack_1b0 = uStack_1b0 + (((secp256k1_gej *)r)->x).n[4];
    iStack_1a4 = 0;
    pcStack_2b8 = (code *)0x148001;
    iStack_1a8 = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    r_02 = (secp256k1_gej *)&((secp256k1_gej *)r)->y;
    pcStack_2b8 = (code *)0x148018;
    secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)(auStack_200 + 0x30),
                     (secp256k1_fe *)auStack_1a0);
    a_04 = (secp256k1_gej *)(auStack_260 + 0x30);
    pcStack_2b8 = (code *)0x148030;
    psVar15 = a_04;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)a_04,(secp256k1_fe *)auStack_260);
    pcStack_2b8 = (code *)0x148038;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2b8 = (code *)0x148040;
    r_00 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iStack_208 = iStack_208 + (((secp256k1_gej *)r)->y).magnitude;
    if (iStack_208 < 0x21) {
      uVar4 = (((secp256k1_gej *)r)->y).n[1];
      uVar5 = (((secp256k1_gej *)r)->y).n[2];
      uVar6 = (((secp256k1_gej *)r)->y).n[3];
      (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._48_8_;
      (((secp256k1_gej *)r)->y).n[1] = uVar4 + uStack_228;
      (((secp256k1_gej *)r)->y).n[2] = uVar5 + uStack_220;
      (((secp256k1_gej *)r)->y).n[3] = uVar6 + uStack_218;
      puVar1 = (((secp256k1_gej *)r)->y).n + 4;
      *puVar1 = *puVar1 + uStack_210;
      (((secp256k1_gej *)r)->y).magnitude = iStack_208;
      (((secp256k1_gej *)r)->y).normalized = 0;
      goto LAB_00147991;
    }
  }
  else {
    pcStack_2b8 = (code *)0x148175;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00148175:
    pcStack_2b8 = (code *)0x14817a;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0014817a:
    pcStack_2b8 = (code *)0x14817f;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0014817f:
    pcStack_2b8 = (code *)0x148184;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00148184:
    pcStack_2b8 = (code *)0x148189;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_00148189:
    pcStack_2b8 = (code *)0x14818e;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  pcStack_2b8 = secp256k1_scalar_cadd_bit;
  secp256k1_gej_add_zinv_var_cold_1();
  uVar8 = (ulong)psVar15 & 0xffffffff;
  pcStack_2d0 = (code *)0x1481a4;
  psVar17 = psVar15;
  r_01 = r_00;
  psStack_2c0 = (secp256k1_gej *)r;
  pcStack_2b8 = (code *)uVar14;
  iStack_2c4 = extraout_EDX;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if ((uint)psVar15 < 0x100) {
    uVar10 = iStack_2c4 - 1U & 0x100 | (uint)psVar15;
    uVar13 = uVar10 >> 6;
    bVar9 = (byte)uVar8;
    uVar21 = (ulong)(uVar10 < 0x40) << (bVar9 & 0x3f);
    psVar17 = (secp256k1_gej *)((ulong)(uVar13 == 1) << (bVar9 & 0x3f));
    uVar19 = (ulong)(uVar13 == 2) << (bVar9 & 0x3f);
    uVar16 = (ulong)(uVar13 == 3) << (bVar9 & 0x3f);
    uVar14 = (r_00->x).n[0];
    (r_00->x).n[0] = (r_00->x).n[0] + uVar21;
    puVar1 = (r_00->x).n + 1;
    uVar21 = (ulong)CARRY8(uVar14,uVar21);
    uVar14 = *puVar1;
    uVar12 = (long)(psVar17->x).n + *puVar1;
    *puVar1 = uVar12 + uVar21;
    puVar1 = (r_00->x).n + 2;
    uVar21 = (ulong)(CARRY8(uVar14,(ulong)psVar17) || CARRY8(uVar12,uVar21));
    uVar14 = *puVar1;
    uVar12 = *puVar1 + uVar19;
    *puVar1 = uVar12 + uVar21;
    puVar1 = (r_00->x).n + 3;
    uVar21 = (ulong)(CARRY8(uVar14,uVar19) || CARRY8(uVar12,uVar21));
    uVar14 = *puVar1;
    uVar12 = *puVar1 + uVar16;
    *puVar1 = uVar12 + uVar21;
    bVar2 = !CARRY8(uVar14,uVar16);
    bVar3 = !CARRY8(uVar12,uVar21);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar2 && bVar3);
    pcStack_2d0 = (code *)0x14820c;
    r_01 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (bVar2 && bVar3) {
      return;
    }
  }
  else {
    pcStack_2d0 = (code *)0x14821d;
    secp256k1_scalar_cadd_bit_cold_2();
  }
  pcStack_2d0 = secp256k1_scalar_get_bits_var;
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_2f8 = (secp256k1_gej *)0x148236;
  psVar15 = psVar17;
  a_01 = r_01;
  psStack_2e8 = r_00;
  psStack_2e0 = r_02;
  psStack_2d8 = a_04;
  pcStack_2d0 = (code *)uVar8;
  secp256k1_scalar_verify((secp256k1_scalar *)r_01);
  if (extraout_EDX_00 - 0x21 < 0xffffffe0) {
    psStack_2f8 = (secp256k1_gej *)0x1482a2;
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else {
    uVar10 = extraout_EDX_00 + (uint)psVar17;
    if (uVar10 < 0x101) {
      if (uVar10 - 1 >> 6 == (uint)(((ulong)psVar17 & 0xffffffff) >> 6)) {
        psStack_2f8 = (secp256k1_gej *)0x148261;
        secp256k1_scalar_verify((secp256k1_scalar *)r_01);
        return;
      }
      if ((uint)psVar17 < 0xc0) {
        return;
      }
      goto LAB_001482a7;
    }
  }
  psStack_2f8 = (secp256k1_gej *)0x1482a7;
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001482a7:
  psStack_2f8 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_318 = (ulong)extraout_EDX_00;
  psStack_310 = a_03;
  uStack_308 = uVar20;
  uStack_300 = (ulong)psVar17 & 0xffffffff;
  psStack_2f8 = r_01;
  secp256k1_gej_verify(psVar15);
  a_02 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (psVar15->infinity == 0) {
    secp256k1_fe_sqr(&sStack_348,&a_00->x);
    secp256k1_fe_mul(&sStack_378,&sStack_348,&a_00->x);
    secp256k1_fe_mul(&a_01->x,&psVar15->x,&sStack_348);
    secp256k1_fe_mul(&a_01->y,&psVar15->y,&sStack_378);
    *(int *)(a_01->z).n = psVar15->infinity;
    secp256k1_ge_verify((secp256k1_ge *)a_01);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_02->infinity = 1;
  (a_02->x).n[0] = 0;
  (a_02->x).n[1] = 0;
  (a_02->x).n[2] = 0;
  (a_02->x).n[3] = 0;
  *(undefined8 *)((long)(a_02->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_02->x).n + 0x24) = 0;
  (a_02->x).normalized = 1;
  secp256k1_fe_verify(&a_02->x);
  *(undefined8 *)((long)(a_02->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_02->y).n + 0x24) = 0;
  (a_02->y).n[2] = 0;
  (a_02->y).n[3] = 0;
  (a_02->y).n[0] = 0;
  (a_02->y).n[1] = 0;
  (a_02->y).normalized = 1;
  secp256k1_fe_verify(&a_02->y);
  secp256k1_ge_verify(a_02);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}